

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O2

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::StoreVariableOperator> *op)

{
  element_type *peVar1;
  VariableName name;
  ostream *poVar2;
  UserDefinedVariableName name_00;
  
  name.no = ProcessOperator(this,&((op->
                                   super___shared_ptr<const_calc4::StoreVariableOperator,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->operand);
  poVar2 = Append(this);
  peVar1 = (op->super___shared_ptr<const_calc4::StoreVariableOperator,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  name_00.name._M_str = (char *)peVar1;
  name_00.name._M_len = (size_t)(peVar1->variableName)._M_dataplus._M_p;
  poVar2 = operator<<((anon_unknown_0 *)poVar2,(ostream *)(peVar1->variableName)._M_string_length,
                      name_00);
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = operator<<(poVar2,name);
  poVar2 = std::operator<<(poVar2,';');
  std::endl<char,std::char_traits<char>>(poVar2);
  Return(this,(optional<int>)((ulong)(uint)name.no | 0x100000000));
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const StoreVariableOperator>& op) override
    {
        int value = ProcessOperator(op->GetOperand());
        Append() << UserDefinedVariableName(op->GetVariableName()) << " = " << VariableName(value)
                 << ';' << std::endl;
        Return(value);
    }